

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::~SkipList(SkipList *this)

{
  Node *pNVar1;
  
  reset(this);
  pNVar1 = this->head;
  if (pNVar1 != (Node *)0x0) {
    std::__cxx11::string::~string((string *)&pNVar1->value);
  }
  operator_delete(pNVar1,0x38);
  std::random_device::~random_device(&this->rd);
  return;
}

Assistant:

SkipList::~SkipList() {
  reset();
  delete head;
}